

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O0

void crnlib::vector<crnlib::optimize_color_params::unpacked_endpoint>::object_mover
               (void *pDst_void,void *pSrc_void,uint num)

{
  unpacked_endpoint *local_38;
  unpacked_endpoint *pDst;
  unpacked_endpoint *pSrc_end;
  unpacked_endpoint *pSrc;
  uint num_local;
  void *pSrc_void_local;
  void *pDst_void_local;
  
  local_38 = (unpacked_endpoint *)pDst_void;
  for (pSrc_end = (unpacked_endpoint *)pSrc_void;
      pSrc_end != (unpacked_endpoint *)((long)pSrc_void + (ulong)num * 8); pSrc_end = pSrc_end + 1)
  {
    optimize_color_params::unpacked_endpoint::unpacked_endpoint(local_38,pSrc_end);
    local_38 = local_38 + 1;
  }
  return;
}

Assistant:

static void object_mover(void* pDst_void, void* pSrc_void, uint num)
        {
            T* pSrc = static_cast<T*>(pSrc_void);
            T* const pSrc_end = pSrc + num;
            T* pDst = static_cast<T*>(pDst_void);

            while (pSrc != pSrc_end)
            {
                // placement new
                new (static_cast<void*>(pDst)) T(*pSrc);
                pSrc->~T();
                ++pSrc;
                ++pDst;
            }
        }